

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O2

bool SetDevice(char *const_id,aint ramtop)

{
  CDeviceDef *pCVar1;
  CDevice **ppCVar2;
  bool bVar3;
  int iVar4;
  CDevice *pCVar5;
  CDeviceSlot *pCVar6;
  size_t sVar7;
  aint pageCount;
  CDevice **ppCVar8;
  long lVar9;
  aint slotCount;
  char *pcVar10;
  uint uVar11;
  int32_t slotSize;
  aint aVar12;
  undefined8 in_R8;
  int *initialPages;
  __normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_> _Var13
  ;
  CDevice *parent;
  uint num;
  __normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_> __it;
  char *id;
  CDeviceDef **local_858;
  long local_850;
  long local_848;
  char *local_840;
  char buf [2048];
  
  if (const_id == (char *)0x0) {
    Device = (CDevice *)0x0;
    DeviceID = (char *)0x0;
    return true;
  }
  id = const_id;
  iVar4 = cmphstr(&id,"none",false);
  pcVar10 = id;
  if (iVar4 != 0) {
    Device = (CDevice *)0x0;
    DeviceID = (char *)0x0;
    return true;
  }
  if ((DeviceID != (char *)0x0) && (iVar4 = strcmp(DeviceID,id), iVar4 == 0)) goto LAB_00109e19;
  DeviceID = (char *)0x0;
  ppCVar2 = &Devices;
  parent = (CDevice *)0x0;
  do {
    ppCVar8 = ppCVar2;
    aVar12 = (aint)in_R8;
    pCVar5 = *ppCVar8;
    if (pCVar5 == (CDevice *)0x0) {
      iVar4 = cmphstr(&id,"zxspectrum48",false);
      if (iVar4 == 0) {
        iVar4 = cmphstr(&id,"zxspectrum128",false);
        if (iVar4 == 0) {
          iVar4 = cmphstr(&id,"zxspectrum256",false);
          if (iVar4 == 0) {
            iVar4 = cmphstr(&id,"zxspectrum512",false);
            if (iVar4 == 0) {
              iVar4 = cmphstr(&id,"zxspectrum1024",false);
              if (iVar4 == 0) {
                iVar4 = cmphstr(&id,"zxspectrum2048",false);
                if (iVar4 == 0) {
                  iVar4 = cmphstr(&id,"zxspectrum4096",false);
                  if (iVar4 == 0) {
                    iVar4 = cmphstr(&id,"zxspectrum8192",false);
                    if (iVar4 == 0) {
                      iVar4 = cmphstr(&id,"zxspectrumnext",false);
                      if (iVar4 == 0) {
                        iVar4 = cmphstr(&id,"noslot64k",false);
                        if (iVar4 != 0) {
                          if (ramtop != 0) {
                            WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
                          }
                          pCVar5 = (CDevice *)operator_new(0x2838);
                          CDevice::CDevice(pCVar5,"NOSLOT64K",parent);
                          *ppCVar8 = pCVar5;
                          initialPages = (int *)buf;
                          buf._0_8_ = (ulong)(uint)buf._4_4_ << 0x20;
                          pageCount = 0x20;
                          aVar12 = 0x10000;
                          slotCount = 1;
                          goto LAB_0010a276;
                        }
                        iVar4 = cmphstr(&id,"amstradcpc464",false);
                        if (iVar4 == 0) {
                          iVar4 = cmphstr(&id,"amstradcpc6128",false);
                          if (iVar4 == 0) {
                            iVar4 = cmphstr(&id,"amstradcpcplus",false);
                            if (iVar4 == 0) {
                              buf._0_8_ = &local_840;
                              local_840 = id;
                              local_858 = DefDevices.
                                          super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish;
                              local_850 = (long)DefDevices.
                                                super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)DefDevices.
                                                super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start;
                              local_848 = local_850 >> 5;
                              __it._M_current =
                                   DefDevices.
                                   super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                              goto LAB_0010a2b9;
                            }
                            if (ramtop != 0) {
                              WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
                            }
                            pCVar5 = (CDevice *)operator_new(0x2838);
                            CDevice::CDevice(pCVar5,"AMSTRADCPCPLUS",parent);
                            *ppCVar8 = pCVar5;
                            pageCount = 0x20;
                          }
                          else {
                            if (ramtop != 0) {
                              WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
                            }
                            pCVar5 = (CDevice *)operator_new(0x2838);
                            CDevice::CDevice(pCVar5,"AMSTRADCPC6128",parent);
                            *ppCVar8 = pCVar5;
                            pageCount = 8;
                          }
                          slotCount = 4;
                          initialPages = (int *)&DAT_00155630;
                          aVar12 = 0x4000;
                        }
                        else {
                          if (ramtop != 0) {
                            WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
                          }
                          pCVar5 = (CDevice *)operator_new(0x2838);
                          CDevice::CDevice(pCVar5,"AMSTRADCPC464",parent);
                          *ppCVar8 = pCVar5;
                          initialPages = (int *)&DAT_00155630;
                          pageCount = 4;
                          aVar12 = 0x4000;
                          slotCount = pageCount;
                        }
                        goto LAB_0010a276;
                      }
                      if (ramtop != 0) {
                        WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
                      }
                      if (Options::IsI8080 == '\x01') {
                        Error("Can\'t use ZXN device while in i8080 assembling mode",line,FATAL);
                      }
                      if (Options::IsLR35902 == '\x01') {
                        Error("Can\'t use ZXN device while in Sharp LR35902 assembling mode",line,
                              FATAL);
                      }
                      pCVar5 = (CDevice *)operator_new(0x2838);
                      CDevice::CDevice(pCVar5,"ZXSPECTRUMNEXT",parent);
                      *ppCVar8 = pCVar5;
                      initRegularSlotDevice(pCVar5,0x2000,8,0xe0,(int *)&DAT_00155610);
                      if (DAT_0018a51c == 0) {
                        DAT_0018a51c = 1;
                        Z80::InitNextExtensions();
                      }
                      break;
                    }
                    pCVar5 = (CDevice *)operator_new(0x2838);
                    CDevice::CDevice(pCVar5,"ZXSPECTRUM8192",parent);
                    *ppCVar8 = pCVar5;
                    iVar4 = 0x155600;
                    slotSize = 0x200;
                  }
                  else {
                    pCVar5 = (CDevice *)operator_new(0x2838);
                    CDevice::CDevice(pCVar5,"ZXSPECTRUM4096",parent);
                    *ppCVar8 = pCVar5;
                    iVar4 = 0x155600;
                    slotSize = 0x100;
                  }
                }
                else {
                  pCVar5 = (CDevice *)operator_new(0x2838);
                  CDevice::CDevice(pCVar5,"ZXSPECTRUM2048",parent);
                  *ppCVar8 = pCVar5;
                  iVar4 = 0x155600;
                  slotSize = 0x80;
                }
              }
              else {
                pCVar5 = (CDevice *)operator_new(0x2838);
                CDevice::CDevice(pCVar5,"ZXSPECTRUM1024",parent);
                *ppCVar8 = pCVar5;
                iVar4 = 0x155600;
                slotSize = 0x40;
              }
            }
            else {
              pCVar5 = (CDevice *)operator_new(0x2838);
              CDevice::CDevice(pCVar5,"ZXSPECTRUM512",parent);
              *ppCVar8 = pCVar5;
              iVar4 = 0x155600;
              slotSize = 0x20;
            }
          }
          else {
            pCVar5 = (CDevice *)operator_new(0x2838);
            CDevice::CDevice(pCVar5,"ZXSPECTRUM256",parent);
            *ppCVar8 = pCVar5;
            iVar4 = 0x155600;
            slotSize = 0x10;
          }
        }
        else {
          pCVar5 = (CDevice *)operator_new(0x2838);
          CDevice::CDevice(pCVar5,"ZXSPECTRUM128",parent);
          *ppCVar8 = pCVar5;
          iVar4 = 0x155600;
          slotSize = 8;
        }
      }
      else {
        pCVar5 = (CDevice *)operator_new(0x2838);
        CDevice::CDevice(pCVar5,"ZXSPECTRUM48",parent);
        *ppCVar8 = pCVar5;
        iVar4 = 0x155630;
        slotSize = 4;
      }
      initZxLikeDevice(pCVar5,slotSize,iVar4,(int *)(ulong)(uint)ramtop,aVar12);
      break;
    }
    iVar4 = strcmp(pCVar5->ID,pcVar10);
    ppCVar2 = &pCVar5->Next;
    parent = pCVar5;
  } while (iVar4 != 0);
LAB_00109dfd:
  Device = *ppCVar8;
  DeviceID = Device->ID;
  CDevice::CheckPage(Device,CHECK_RESET);
LAB_00109e19:
  if ((ramtop != 0) && (Device->ZxRamTop != ramtop && Device->ZxRamTop != 0)) {
    WarningById(W_DEV_RAMTOP,(char *)0x0,W_PASS3);
  }
  bVar3 = IsSldExportActive();
  if (!bVar3) {
    return true;
  }
  pCVar6 = CDevice::GetCurrentSlot(Device);
  uVar11 = Device->SlotsCount;
  snprintf(buf,0x800,"pages.size:%d,pages.count:%d,slots.count:%d",(ulong)(uint)pCVar6->Size,
           (ulong)(uint)Device->PagesCount,(ulong)uVar11);
  if ((int)uVar11 < 1) {
    uVar11 = 0;
  }
  for (num = 0; uVar11 != num; num = num + 1) {
    sVar7 = strlen(buf);
    pcVar10 = ",%d";
    if (num == 0) {
      pcVar10 = ",slots.adr:%d";
    }
    pCVar6 = CDevice::GetSlot(Device,num);
    snprintf(buf + sVar7,0x800 - sVar7,pcVar10,(ulong)(uint)pCVar6->Address);
  }
  WriteToSldFile(-1,-1,'Z',buf);
  return true;
LAB_0010a2b9:
  _Var13._M_current = __it._M_current;
  if (local_848 < 1) goto LAB_0010a32e;
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::$_0>::operator()
                    ((_Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::__0> *)
                     buf,__it);
  if (bVar3) goto LAB_0010a392;
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::$_0>::operator()
                    ((_Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::__0> *)
                     buf,(__normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
                          )(__it._M_current + 1));
  _Var13._M_current = __it._M_current + 1;
  if (bVar3) goto LAB_0010a392;
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::$_0>::operator()
                    ((_Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::__0> *)
                     buf,(__normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
                          )(__it._M_current + 2));
  _Var13._M_current = __it._M_current + 2;
  if (bVar3) goto LAB_0010a392;
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::$_0>::operator()
                    ((_Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::__0> *)
                     buf,(__normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
                          )(__it._M_current + 3));
  _Var13._M_current = __it._M_current + 3;
  if (bVar3) goto LAB_0010a392;
  __it._M_current = __it._M_current + 4;
  local_848 = local_848 + -1;
  local_850 = local_850 + -0x20;
  goto LAB_0010a2b9;
LAB_0010a32e:
  lVar9 = local_850 >> 3;
  if (lVar9 == 1) {
LAB_0010a37a:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::$_0>::operator()
                      ((_Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::__0> *)
                       buf,__it);
    _Var13._M_current = __it._M_current;
    if (!bVar3) {
      _Var13._M_current = local_858;
    }
  }
  else if (lVar9 == 2) {
LAB_0010a365:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::$_0>::operator()
                      ((_Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::__0> *)
                       buf,__it);
    _Var13._M_current = __it._M_current;
    if (!bVar3) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0010a37a;
    }
  }
  else {
    if (lVar9 != 3) {
      return false;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::$_0>::operator()
                      ((_Iter_pred<SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::__0> *)
                       buf,__it);
    if (!bVar3) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0010a365;
    }
  }
LAB_0010a392:
  if (local_858 == _Var13._M_current) {
    return false;
  }
  pCVar1 = *_Var13._M_current;
  if (ramtop != 0) {
    WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
  }
  pCVar5 = (CDevice *)operator_new(0x2838);
  CDevice::CDevice(pCVar5,pCVar1->ID,parent);
  *ppCVar8 = pCVar5;
  aVar12 = pCVar1->SlotSize;
  slotCount = pCVar1->SlotsCount;
  pageCount = pCVar1->PagesCount;
  initialPages = pCVar1->initialPages;
LAB_0010a276:
  initRegularSlotDevice(pCVar5,aVar12,slotCount,pageCount,initialPages);
  goto LAB_00109dfd;
}

Assistant:

bool SetDevice(const char *const_id, const aint ramtop) {
	CDevice** dev;
	CDevice* parent = nullptr;
	char* id = const_cast<char*>(const_id);		//TODO cmphstr for both const/nonconst variants?
		// ^ argument is const because of lua bindings

	if (!id || cmphstr(id, "none")) {
		DeviceID = nullptr;
		Device = nullptr;
		return true;
	}

	if (!DeviceID || strcmp(DeviceID, id)) {	// different device than current, change to it
		DeviceID = nullptr;
		dev = &Devices;
		// search for device
		while (*dev) {
			parent = *dev;
			if (!strcmp(parent->ID, id)) break;
			dev = &(parent->Next);
		}
		if (nullptr == (*dev)) {	// device not found
			if (cmphstr(id, "zxspectrum48")) {			// must be lowercase to catch both cases
				DeviceZXSpectrum48(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum128")) {
				DeviceZXSpectrum128(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum256")) {
				DeviceZXSpectrum256(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum512")) {
				DeviceZXSpectrum512(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum1024")) {
				DeviceZXSpectrum1024(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum2048")) {
				DeviceZXSpectrum2048(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum4096")) {
				DeviceZXSpectrum4096(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum8192")) {
				DeviceZXSpectrum8192(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrumnext")) {
				DeviceZxSpectrumNext(dev, parent, ramtop);
			} else if (cmphstr(id, "noslot64k")) {
				DeviceNoSlot64k(dev, parent, ramtop);
			} else if (cmphstr(id, "amstradcpc464")) {
				DeviceAmstradCPC464(dev, parent, ramtop);
			} else if (cmphstr(id, "amstradcpc6128")) {
				DeviceAmstradCPC6128(dev, parent, ramtop);
			} else if (cmphstr(id, "amstradcpcplus")) {
				DeviceAmstradCPCPLUS(dev, parent, ramtop);
			} else if (!SetUserDefinedDevice(id, dev, parent, ramtop)) {
				return false;
			}
		}
		// set up the found/new device
		Device = (*dev);
		DeviceID = Device->ID;
		Device->CheckPage(CDevice::CHECK_RESET);
	}
	if (ramtop && Device->ZxRamTop && ramtop != Device->ZxRamTop) {
		WarningById(W_DEV_RAMTOP);
	}
	if (IsSldExportActive()) {
		// SLD tracing data are being exported, export the device data
		int pageSize = Device->GetCurrentSlot()->Size;
		int pageCount = Device->PagesCount;
		int slotsCount = Device->SlotsCount;
		char buf[LINEMAX];
		snprintf(buf, LINEMAX, "pages.size:%d,pages.count:%d,slots.count:%d",
			pageSize, pageCount, slotsCount
		);
		for (int slotI = 0; slotI < slotsCount; ++slotI) {
			size_t bufLen = strlen(buf);
			char* bufAppend = buf + bufLen;
			snprintf(bufAppend, LINEMAX-bufLen,
						(0 == slotI) ? ",slots.adr:%d" : ",%d",
						Device->GetSlot(slotI)->Address);
		}
		// pagesize
		WriteToSldFile(-1,-1,'Z',buf);
	}
	return true;
}